

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_tests.cpp
# Opt level: O0

void immutable::test_push_tail2(void)

{
  char *pcVar1;
  uint32_t local_34;
  char ch;
  int i_1;
  int local_28;
  int i;
  ref<immutable::rrb<char,_true,_5>_> local_18;
  ref<immutable::rrb<char,_true,_5>_> new_tree;
  ref<immutable::rrb<char,_true,_5>_> tree;
  
  rrb_create<char,true,5>();
  ref<immutable::rrb<char,_true,_5>_>::ref(&local_18);
  for (local_28 = 0; local_28 < 0x32; local_28 = local_28 + 1) {
    rrb_push<char,true,5>((immutable *)&stack0xffffffffffffffd0,&new_tree,(char)local_28 + ' ');
    ref<immutable::rrb<char,_true,_5>_>::operator=
              (&local_18,(ref<immutable::rrb<char,_true,_5>_> *)&stack0xffffffffffffffd0);
    ref<immutable::rrb<char,_true,_5>_>::~ref
              ((ref<immutable::rrb<char,_true,_5>_> *)&stack0xffffffffffffffd0);
    ref<immutable::rrb<char,_true,_5>_>::operator=(&new_tree,&local_18);
  }
  for (local_34 = 0; (int)local_34 < 0x32; local_34 = local_34 + 1) {
    pcVar1 = rrb_nth<char,true,5>(&new_tree,local_34);
    TestEq<char,char>((char)local_34 + ' ',*pcVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                      ,0x4c,"void immutable::test_push_tail2()");
  }
  ref<immutable::rrb<char,_true,_5>_>::~ref(&local_18);
  ref<immutable::rrb<char,_true,_5>_>::~ref(&new_tree);
  return;
}

Assistant:

void test_push_tail2()
    {
    ref<rrb<char>> tree = rrb_create<char, true, 5>();

    ref<rrb<char>> new_tree;
    for (int i = 0; i < 50; ++i)
      {
      new_tree = rrb_push(tree, (char)(i + 32));
      tree = new_tree;
      }

    for (int i = 0; i < 50; ++i)
      {
      char ch = rrb_nth(tree, i);
      TEST_EQ((char)(i + 32), ch);
      }
    }